

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O0

int uttamarin::EditDistanceHelper
              (string *A,int a,string *B,int b,
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *dp)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  reference pvVar6;
  reference pvVar7;
  char *pcVar8;
  int *piVar9;
  int local_48;
  uint local_44;
  int keep_or_modify;
  int modification_cost;
  int remove;
  int add;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *dp_local;
  string *psStack_28;
  int b_local;
  string *B_local;
  string *psStack_18;
  int a_local;
  string *A_local;
  
  _remove = dp;
  dp_local._4_4_ = b;
  psStack_28 = B;
  B_local._4_4_ = a;
  psStack_18 = A;
  lVar4 = std::__cxx11::string::size();
  if (a == lVar4) {
    iVar3 = std::__cxx11::string::size();
    A_local._4_4_ = iVar3 - dp_local._4_4_;
  }
  else {
    lVar4 = (long)dp_local._4_4_;
    lVar5 = std::__cxx11::string::size();
    if (lVar4 == lVar5) {
      iVar3 = std::__cxx11::string::size();
      A_local._4_4_ = iVar3 - B_local._4_4_;
    }
    else {
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](_remove,(long)B_local._4_4_);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)dp_local._4_4_);
      if (*pvVar7 == -1) {
        iVar3 = EditDistanceHelper(psStack_18,B_local._4_4_,psStack_28,dp_local._4_4_ + 1,_remove);
        modification_cost = iVar3 + 1;
        iVar3 = EditDistanceHelper(psStack_18,B_local._4_4_ + 1,psStack_28,dp_local._4_4_,_remove);
        keep_or_modify = iVar3 + 1;
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
        cVar1 = *pcVar8;
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)psStack_28);
        cVar2 = *pcVar8;
        local_44 = (uint)(cVar1 != cVar2);
        local_48 = EditDistanceHelper(psStack_18,B_local._4_4_ + 1,psStack_28,dp_local._4_4_ + 1,
                                      _remove);
        local_48 = (uint)(cVar1 != cVar2) + local_48;
        piVar9 = CLI::std::min<int>(&keep_or_modify,&local_48);
        piVar9 = CLI::std::min<int>(&modification_cost,piVar9);
        iVar3 = *piVar9;
        pvVar6 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](_remove,(long)B_local._4_4_);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)dp_local._4_4_);
        *pvVar7 = iVar3;
      }
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](_remove,(long)B_local._4_4_);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)dp_local._4_4_);
      A_local._4_4_ = *pvVar7;
    }
  }
  return A_local._4_4_;
}

Assistant:

int EditDistanceHelper(const string& A, int a, const string& B, int b,
                       vector<vector<int>>& dp) { 
  if(a == A.size()) return B.size() - b; 
  if(b == B.size()) return A.size() - a; 
  if(dp[a][b] == -1) { 
    int add = 1 + EditDistanceHelper(A, a, B, b+1, dp); 
    int remove = 1 + EditDistanceHelper(A, a+1, B, b, dp); 
    int modification_cost = A[a] == B[b] ? 0 : 1; 
    int keep_or_modify = modification_cost + 
      EditDistanceHelper(A, a+1, B, b+1, dp); 
    dp[a][b] = std::min(add, std::min(remove, keep_or_modify)); 
  } 
  return dp[a][b]; 
}